

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<double>::ExtractCoarse
          (TPZDohrAssembly<double> *this,int isub,TPZFMatrix<double> *global,
          TPZFMatrix<double> *local)

{
  int iVar1;
  TPZVec<int> *this_00;
  int64_t iVar2;
  int *piVar3;
  double *pdVar4;
  TPZFMatrix<double> *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  double extraout_XMM0_Qa;
  int ic;
  int ncols;
  int ieq;
  int neq;
  TPZVec<int> *avec;
  int local_38;
  int iVar5;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 0x28),(long)in_ESI);
  iVar2 = TPZVec<int>::NElements(this_00);
  iVar1 = (int)iVar2;
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  (*(in_RCX->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (in_RCX,(long)iVar1,(long)(int)iVar2);
  for (local_38 = 0; local_38 < (int)iVar2; local_38 = local_38 + 1) {
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      piVar3 = TPZVec<int>::operator[](this_00,(long)iVar5);
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,(long)*piVar3,(long)local_38);
      pdVar4 = TPZFMatrix<double>::operator()(in_RCX,(int64_t)this_00,CONCAT44(iVar1,iVar5));
      *pdVar4 = extraout_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}